

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void pack_inter_mode_mvs(AV1_COMP *cpi,ThreadData_conflict *td,aom_writer *w)

{
  PREDICTION_MODE mode_00;
  BLOCK_SIZE sb_type;
  undefined2 uVar1;
  long lVar2;
  MB_MODE_INFO *mbmi_00;
  long lVar3;
  int16_t iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long in_RSI;
  long in_RDI;
  int comp_index_ctx;
  int ctx_comp_group_idx;
  int masked_compound_used;
  int bsize_group;
  int interintra;
  int_mv ref_mv_2;
  nmv_context *nmvc_2;
  int_mv ref_mv_1;
  nmv_context *nmvc_1;
  int_mv ref_mv;
  nmv_context *nmvc;
  int16_t mode_ctx;
  int skip;
  int ref;
  int is_compound;
  int is_inter;
  int allow_hp;
  BLOCK_SIZE bsize;
  uint8_t segment_id;
  PREDICTION_MODE mode;
  MB_MODE_INFO_EXT_FRAME *mbmi_ext_frame;
  MB_MODE_INFO *mbmi;
  segmentation_probs *segp;
  segmentation *seg;
  FRAME_CONTEXT *ec_ctx;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  AV1_COMMON *cm;
  undefined4 uVar8;
  uint bits;
  undefined2 in_stack_ffffffffffffff3c;
  int16_t in_stack_ffffffffffffff3e;
  undefined2 in_stack_ffffffffffffff40;
  BLOCK_SIZE in_stack_ffffffffffffff42;
  BLOCK_SIZE in_stack_ffffffffffffff43;
  COMPOUND_TYPE type;
  undefined4 in_stack_ffffffffffffff44;
  int is_inter_00;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  uint in_stack_ffffffffffffff58;
  int_mv in_stack_ffffffffffffff5c;
  ThreadData_conflict *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int_mv in_stack_ffffffffffffff6c;
  AV1_COMP *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int usehp;
  AV1_COMMON *in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8e;
  undefined4 in_stack_ffffffffffffff90;
  int iVar9;
  int in_stack_ffffffffffffff94;
  
  lVar2 = *(long *)(in_RSI + 0x2b38);
  mbmi_00 = (MB_MODE_INFO *)**(undefined8 **)(in_RSI + 0x2058);
  lVar3 = *(long *)(in_RSI + 0x4178);
  mode_00 = mbmi_00->mode;
  uVar1 = *(undefined2 *)&mbmi_00->field_0xa7;
  sb_type = mbmi_00->bsize;
  uVar5 = (uint)(*(byte *)(in_RDI + 0x3c16d) & 1);
  iVar6 = is_inter_block((MB_MODE_INFO *)
                         CONCAT44(in_stack_ffffffffffffff44,
                                  CONCAT13(in_stack_ffffffffffffff43,
                                           CONCAT12(in_stack_ffffffffffffff42,
                                                    in_stack_ffffffffffffff40))));
  iVar7 = has_second_ref(mbmi_00);
  uVar8 = 1;
  write_inter_segment_id
            ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (MACROBLOCKD *)CONCAT26(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88),
             (aom_writer *)in_stack_ffffffffffffff80,
             (segmentation *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             (segmentation_probs *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c.as_int,uVar5)
  ;
  write_skip_mode((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff5c.as_int,in_stack_ffffffffffffff58)
                  ,(MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                  (uint8_t)((uint)in_stack_ffffffffffffff4c >> 0x18),
                  (MB_MODE_INFO *)
                  CONCAT44(in_stack_ffffffffffffff44,
                           CONCAT13(in_stack_ffffffffffffff43,
                                    CONCAT12(in_stack_ffffffffffffff42,in_stack_ffffffffffffff40))),
                  (aom_writer *)
                  CONCAT26(in_stack_ffffffffffffff3e,CONCAT24(in_stack_ffffffffffffff3c,uVar8)));
  if ((*(ushort *)&mbmi_00->field_0xa7 >> 6 & 1) == 0) {
    is_inter_00 = write_skip((AV1_COMMON *)
                             CONCAT44(in_stack_ffffffffffffff6c.as_int,in_stack_ffffffffffffff68),
                             (MACROBLOCKD *)in_stack_ffffffffffffff60,
                             (uint8_t)((uint)in_stack_ffffffffffffff5c >> 0x18),
                             (MB_MODE_INFO *)
                             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                             (aom_writer *)
                             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  }
  else {
    is_inter_00 = 1;
  }
  bits = 0;
  iVar9 = is_inter_00;
  write_inter_segment_id
            ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff94,is_inter_00),
             (MACROBLOCKD *)CONCAT26(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88),
             (aom_writer *)in_stack_ffffffffffffff80,
             (segmentation *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             (segmentation_probs *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c.as_int,uVar5)
  ;
  write_cdef((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff94,iVar9),
             (MACROBLOCKD *)CONCAT26(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88),
             (aom_writer *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  write_delta_q_params
            (in_stack_ffffffffffffff80,
             (MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
             (aom_writer *)CONCAT44(in_stack_ffffffffffffff6c.as_int,in_stack_ffffffffffffff68));
  if ((*(ushort *)&mbmi_00->field_0xa7 >> 6 & 1) == 0) {
    write_is_inter((AV1_COMMON *)in_stack_ffffffffffffff60,
                   (MACROBLOCKD *)
                   CONCAT44(in_stack_ffffffffffffff5c.as_int,in_stack_ffffffffffffff58),
                   (uint8_t)(in_stack_ffffffffffffff54 >> 0x18),
                   (aom_writer *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   is_inter_00);
  }
  if ((*(ushort *)&mbmi_00->field_0xa7 >> 6 & 1) == 0) {
    if (iVar6 == 0) {
      write_intra_prediction_modes
                (in_stack_ffffffffffffff80,
                 (MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                 (aom_writer *)CONCAT44(in_stack_ffffffffffffff6c.as_int,in_stack_ffffffffffffff68))
      ;
    }
    else {
      av1_collect_neighbors_ref_counts
                ((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      usehp = (int)in_stack_ffffffffffffff80;
      write_ref_frames((AV1_COMMON *)segp,(MACROBLOCKD *)mbmi,(aom_writer *)mbmi_ext_frame);
      iVar4 = mode_context_analyzer(*(int16_t *)(lVar3 + 0x4c),mbmi_00->ref_frame);
      iVar6 = segfeature_active((segmentation *)(in_RDI + 0x409b8),(byte)uVar1 & 7,'\x06');
      if (iVar6 == 0) {
        iVar6 = is_inter_compound_mode(mode_00);
        if (iVar6 == 0) {
          iVar6 = is_inter_singleref_mode(mode_00);
          if (iVar6 != 0) {
            write_inter_mode((aom_writer *)
                             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                             (PREDICTION_MODE)((uint)in_stack_ffffffffffffff4c >> 0x18),
                             (FRAME_CONTEXT *)
                             CONCAT44(is_inter_00,
                                      CONCAT13(in_stack_ffffffffffffff43,
                                               CONCAT12(in_stack_ffffffffffffff42,
                                                        in_stack_ffffffffffffff40))),
                             in_stack_ffffffffffffff3e);
          }
        }
        else {
          write_inter_compound_mode
                    ((MACROBLOCKD *)
                     CONCAT44(is_inter_00,
                              CONCAT13(in_stack_ffffffffffffff43,
                                       CONCAT12(in_stack_ffffffffffffff42,in_stack_ffffffffffffff40)
                                      )),
                     (aom_writer *)
                     CONCAT26(in_stack_ffffffffffffff3e,CONCAT24(in_stack_ffffffffffffff3c,bits)),
                     '\0',0);
        }
        if (((mode_00 == '\x10') || (mode_00 == '\x18')) ||
           (iVar6 = have_nearmv_in_inter_mode(mode_00), iVar6 != 0)) {
          write_drl_idx((FRAME_CONTEXT *)in_stack_ffffffffffffff60,
                        (MB_MODE_INFO *)
                        CONCAT44(in_stack_ffffffffffffff5c.as_int,in_stack_ffffffffffffff58),
                        (MB_MODE_INFO_EXT_FRAME *)
                        CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        (aom_writer *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
          ;
        }
      }
      if ((mode_00 == '\x10') || (mode_00 == '\x18')) {
        for (in_stack_ffffffffffffff94 = 0; in_stack_ffffffffffffff94 < iVar7 + 1;
            in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 + 1) {
          iVar6 = (int)lVar2 + 0x2e88;
          bits = uVar5;
          get_ref_mv((MACROBLOCK *)
                     CONCAT44(in_stack_ffffffffffffff5c.as_int,in_stack_ffffffffffffff58),
                     in_stack_ffffffffffffff54);
          uVar5 = bits;
          av1_encode_mv(in_stack_ffffffffffffff70,
                        (aom_writer *)
                        CONCAT44(in_stack_ffffffffffffff6c.as_int,in_stack_ffffffffffffff68),
                        in_stack_ffffffffffffff60,
                        (MV *)CONCAT44(in_stack_ffffffffffffff5c.as_int,in_stack_ffffffffffffff58),
                        (MV *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        (nmv_context *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                        ,iVar6);
        }
      }
      else if ((mode_00 == '\x13') || (mode_00 == '\x15')) {
        in_stack_ffffffffffffff70 = (AV1_COMP *)(lVar2 + 0x2e88);
        bits = uVar5;
        in_stack_ffffffffffffff6c =
             get_ref_mv((MACROBLOCK *)
                        CONCAT44(in_stack_ffffffffffffff5c.as_int,in_stack_ffffffffffffff58),
                        in_stack_ffffffffffffff54);
        av1_encode_mv(in_stack_ffffffffffffff70,
                      (aom_writer *)
                      CONCAT44(in_stack_ffffffffffffff6c.as_int,in_stack_ffffffffffffff68),
                      in_stack_ffffffffffffff60,
                      (MV *)CONCAT44(in_stack_ffffffffffffff5c.as_int,in_stack_ffffffffffffff58),
                      (MV *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      (nmv_context *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                      usehp);
      }
      else if ((mode_00 == '\x14') || (mode_00 == '\x16')) {
        in_stack_ffffffffffffff60 = (ThreadData_conflict *)(lVar2 + 0x2e88);
        bits = uVar5;
        in_stack_ffffffffffffff5c =
             get_ref_mv((MACROBLOCK *)
                        CONCAT44(in_stack_ffffffffffffff5c.as_int,in_stack_ffffffffffffff58),
                        in_stack_ffffffffffffff54);
        av1_encode_mv(in_stack_ffffffffffffff70,
                      (aom_writer *)
                      CONCAT44(in_stack_ffffffffffffff6c.as_int,in_stack_ffffffffffffff68),
                      in_stack_ffffffffffffff60,
                      (MV *)CONCAT44(in_stack_ffffffffffffff5c.as_int,in_stack_ffffffffffffff58),
                      (MV *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      (nmv_context *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                      usehp);
      }
      if (((*(char *)(in_RDI + 0x3bf81) != '\x01') &&
          (*(char *)(*(long *)(in_RDI + 0x42008) + 0x3e) != '\0')) &&
         (iVar6 = is_interintra_allowed
                            ((MB_MODE_INFO *)
                             CONCAT44(is_inter_00,
                                      CONCAT13(in_stack_ffffffffffffff43,
                                               CONCAT12(in_stack_ffffffffffffff42,
                                                        in_stack_ffffffffffffff40)))), iVar6 != 0))
      {
        in_stack_ffffffffffffff58 = (uint)(mbmi_00->ref_frame[1] == '\0');
        in_stack_ffffffffffffff54 = (uint)""[sb_type];
        aom_write_symbol((aom_writer *)(ulong)CONCAT14(""[sb_type],in_stack_ffffffffffffff50),
                         in_stack_ffffffffffffff4c,
                         (aom_cdf_prob *)
                         CONCAT44(is_inter_00,
                                  CONCAT13(in_stack_ffffffffffffff43,
                                           CONCAT12(in_stack_ffffffffffffff42,
                                                    in_stack_ffffffffffffff40))),
                         CONCAT22(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c));
        if (in_stack_ffffffffffffff58 != 0) {
          aom_write_symbol((aom_writer *)
                           CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                           in_stack_ffffffffffffff4c,
                           (aom_cdf_prob *)
                           CONCAT44(is_inter_00,
                                    CONCAT13(in_stack_ffffffffffffff43,
                                             CONCAT12(in_stack_ffffffffffffff42,
                                                      in_stack_ffffffffffffff40))),
                           CONCAT22(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c));
          iVar6 = av1_is_wedge_used(sb_type);
          if ((iVar6 != 0) &&
             (aom_write_symbol((aom_writer *)
                               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                               in_stack_ffffffffffffff4c,
                               (aom_cdf_prob *)
                               CONCAT44(is_inter_00,
                                        CONCAT13(in_stack_ffffffffffffff43,
                                                 CONCAT12(in_stack_ffffffffffffff42,
                                                          in_stack_ffffffffffffff40))),
                               CONCAT22(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c)),
             (*(ushort *)&mbmi_00->field_0xa7 >> 10 & 1) != 0)) {
            aom_write_symbol((aom_writer *)
                             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                             in_stack_ffffffffffffff4c,
                             (aom_cdf_prob *)
                             CONCAT44(is_inter_00,
                                      CONCAT13(in_stack_ffffffffffffff43,
                                               CONCAT12(in_stack_ffffffffffffff42,
                                                        in_stack_ffffffffffffff40))),
                             CONCAT22(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c));
          }
        }
      }
      if (mbmi_00->ref_frame[1] != '\0') {
        write_motion_mode((AV1_COMMON *)in_stack_ffffffffffffff60,
                          (MACROBLOCKD *)
                          CONCAT44(in_stack_ffffffffffffff5c.as_int,in_stack_ffffffffffffff58),
                          (MB_MODE_INFO *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          (aom_writer *)
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      }
      iVar6 = has_second_ref(mbmi_00);
      if (iVar6 != 0) {
        iVar6 = is_any_masked_compound_used(in_stack_ffffffffffffff43);
        type = false;
        if (iVar6 != 0) {
          type = *(char *)(*(long *)(in_RDI + 0x42008) + 0x3f) != '\0';
        }
        uVar5 = (uint)type;
        if (uVar5 != 0) {
          in_stack_ffffffffffffff4c =
               get_comp_group_idx_context((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff54,uVar5));
          aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffff54,uVar5),
                           in_stack_ffffffffffffff4c,
                           (aom_cdf_prob *)
                           CONCAT44(is_inter_00,
                                    CONCAT13(type,CONCAT12(in_stack_ffffffffffffff42,
                                                           in_stack_ffffffffffffff40))),
                           CONCAT22(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c));
        }
        if ((*(ushort *)&mbmi_00->field_0xa7 & 0x100) == 0) {
          if (*(int *)(*(long *)(in_RDI + 0x42008) + 0x30) != 0) {
            get_comp_index_context
                      ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff94,iVar9),
                       (MACROBLOCKD *)CONCAT26(iVar4,in_stack_ffffffffffffff88));
            aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffff54,uVar5),
                             in_stack_ffffffffffffff4c,
                             (aom_cdf_prob *)
                             CONCAT44(is_inter_00,
                                      CONCAT13(type,CONCAT12(in_stack_ffffffffffffff42,
                                                             in_stack_ffffffffffffff40))),
                             CONCAT22(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c));
          }
        }
        else {
          iVar6 = is_interinter_compound_used(type,in_stack_ffffffffffffff42);
          if (iVar6 != 0) {
            aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffff54,uVar5),
                             in_stack_ffffffffffffff4c,
                             (aom_cdf_prob *)
                             CONCAT44(is_inter_00,
                                      CONCAT13(type,CONCAT12(in_stack_ffffffffffffff42,
                                                             in_stack_ffffffffffffff40))),
                             CONCAT22(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c));
          }
          if ((mbmi_00->interinter_comp).type == '\x02') {
            aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffff54,uVar5),
                             in_stack_ffffffffffffff4c,
                             (aom_cdf_prob *)
                             CONCAT44(is_inter_00,
                                      CONCAT13(type,CONCAT12(in_stack_ffffffffffffff42,
                                                             in_stack_ffffffffffffff40))),
                             CONCAT22(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c));
            aom_write_bit((aom_writer *)
                          CONCAT44(is_inter_00,
                                   CONCAT13(type,CONCAT12(in_stack_ffffffffffffff42,
                                                          in_stack_ffffffffffffff40))),
                          CONCAT22(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c));
          }
          else {
            aom_write_literal((aom_writer *)
                              CONCAT44(is_inter_00,
                                       CONCAT13(type,CONCAT12(in_stack_ffffffffffffff42,
                                                              in_stack_ffffffffffffff40))),
                              CONCAT22(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c),bits);
          }
        }
      }
      write_mb_interp_filter
                ((AV1_COMMON *)in_stack_ffffffffffffff70,
                 (ThreadData_conflict *)
                 CONCAT44(in_stack_ffffffffffffff6c.as_int,in_stack_ffffffffffffff68),
                 (aom_writer *)in_stack_ffffffffffffff60);
    }
  }
  return;
}

Assistant:

static inline void pack_inter_mode_mvs(AV1_COMP *cpi, ThreadData *const td,
                                       aom_writer *w) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  const struct segmentation *const seg = &cm->seg;
  struct segmentation_probs *const segp = &ec_ctx->seg;
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  const MB_MODE_INFO_EXT_FRAME *const mbmi_ext_frame = x->mbmi_ext_frame;
  const PREDICTION_MODE mode = mbmi->mode;
  const uint8_t segment_id = mbmi->segment_id;
  const BLOCK_SIZE bsize = mbmi->bsize;
  const int allow_hp = cm->features.allow_high_precision_mv;
  const int is_inter = is_inter_block(mbmi);
  const int is_compound = has_second_ref(mbmi);
  int ref;

  write_inter_segment_id(cpi, xd, w, seg, segp, 0, 1);

  write_skip_mode(cm, xd, segment_id, mbmi, w);

  assert(IMPLIES(mbmi->skip_mode, mbmi->skip_txfm));
  const int skip =
      mbmi->skip_mode ? 1 : write_skip(cm, xd, segment_id, mbmi, w);

  write_inter_segment_id(cpi, xd, w, seg, segp, skip, 0);

  write_cdef(cm, xd, w, skip);

  write_delta_q_params(cm, xd, skip, w);

  if (!mbmi->skip_mode) write_is_inter(cm, xd, mbmi->segment_id, w, is_inter);

  if (mbmi->skip_mode) return;

  if (!is_inter) {
    write_intra_prediction_modes(cm, xd, 0, w);
  } else {
    int16_t mode_ctx;

    av1_collect_neighbors_ref_counts(xd);

    write_ref_frames(cm, xd, w);

    mode_ctx =
        mode_context_analyzer(mbmi_ext_frame->mode_context, mbmi->ref_frame);

    // If segment skip is not enabled code the mode.
    if (!segfeature_active(seg, segment_id, SEG_LVL_SKIP)) {
      if (is_inter_compound_mode(mode))
        write_inter_compound_mode(xd, w, mode, mode_ctx);
      else if (is_inter_singleref_mode(mode))
        write_inter_mode(w, mode, ec_ctx, mode_ctx);

      if (mode == NEWMV || mode == NEW_NEWMV || have_nearmv_in_inter_mode(mode))
        write_drl_idx(ec_ctx, mbmi, mbmi_ext_frame, w);
      else
        assert(mbmi->ref_mv_idx == 0);
    }

    if (mode == NEWMV || mode == NEW_NEWMV) {
      for (ref = 0; ref < 1 + is_compound; ++ref) {
        nmv_context *nmvc = &ec_ctx->nmvc;
        const int_mv ref_mv = get_ref_mv(x, ref);
        av1_encode_mv(cpi, w, td, &mbmi->mv[ref].as_mv, &ref_mv.as_mv, nmvc,
                      allow_hp);
      }
    } else if (mode == NEAREST_NEWMV || mode == NEAR_NEWMV) {
      nmv_context *nmvc = &ec_ctx->nmvc;
      const int_mv ref_mv = get_ref_mv(x, 1);
      av1_encode_mv(cpi, w, td, &mbmi->mv[1].as_mv, &ref_mv.as_mv, nmvc,
                    allow_hp);
    } else if (mode == NEW_NEARESTMV || mode == NEW_NEARMV) {
      nmv_context *nmvc = &ec_ctx->nmvc;
      const int_mv ref_mv = get_ref_mv(x, 0);
      av1_encode_mv(cpi, w, td, &mbmi->mv[0].as_mv, &ref_mv.as_mv, nmvc,
                    allow_hp);
    }

    if (cpi->common.current_frame.reference_mode != COMPOUND_REFERENCE &&
        cpi->common.seq_params->enable_interintra_compound &&
        is_interintra_allowed(mbmi)) {
      const int interintra = mbmi->ref_frame[1] == INTRA_FRAME;
      const int bsize_group = size_group_lookup[bsize];
      aom_write_symbol(w, interintra, ec_ctx->interintra_cdf[bsize_group], 2);
      if (interintra) {
        aom_write_symbol(w, mbmi->interintra_mode,
                         ec_ctx->interintra_mode_cdf[bsize_group],
                         INTERINTRA_MODES);
        if (av1_is_wedge_used(bsize)) {
          aom_write_symbol(w, mbmi->use_wedge_interintra,
                           ec_ctx->wedge_interintra_cdf[bsize], 2);
          if (mbmi->use_wedge_interintra) {
            aom_write_symbol(w, mbmi->interintra_wedge_index,
                             ec_ctx->wedge_idx_cdf[bsize], MAX_WEDGE_TYPES);
          }
        }
      }
    }

    if (mbmi->ref_frame[1] != INTRA_FRAME) write_motion_mode(cm, xd, mbmi, w);

    // First write idx to indicate current compound inter prediction mode group
    // Group A (0): dist_wtd_comp, compound_average
    // Group B (1): interintra, compound_diffwtd, wedge
    if (has_second_ref(mbmi)) {
      const int masked_compound_used = is_any_masked_compound_used(bsize) &&
                                       cm->seq_params->enable_masked_compound;

      if (masked_compound_used) {
        const int ctx_comp_group_idx = get_comp_group_idx_context(xd);
        aom_write_symbol(w, mbmi->comp_group_idx,
                         ec_ctx->comp_group_idx_cdf[ctx_comp_group_idx], 2);
      } else {
        assert(mbmi->comp_group_idx == 0);
      }

      if (mbmi->comp_group_idx == 0) {
        if (mbmi->compound_idx)
          assert(mbmi->interinter_comp.type == COMPOUND_AVERAGE);

        if (cm->seq_params->order_hint_info.enable_dist_wtd_comp) {
          const int comp_index_ctx = get_comp_index_context(cm, xd);
          aom_write_symbol(w, mbmi->compound_idx,
                           ec_ctx->compound_index_cdf[comp_index_ctx], 2);
        } else {
          assert(mbmi->compound_idx == 1);
        }
      } else {
        assert(cpi->common.current_frame.reference_mode != SINGLE_REFERENCE &&
               is_inter_compound_mode(mbmi->mode) &&
               mbmi->motion_mode == SIMPLE_TRANSLATION);
        assert(masked_compound_used);
        // compound_diffwtd, wedge
        assert(mbmi->interinter_comp.type == COMPOUND_WEDGE ||
               mbmi->interinter_comp.type == COMPOUND_DIFFWTD);

        if (is_interinter_compound_used(COMPOUND_WEDGE, bsize))
          aom_write_symbol(w, mbmi->interinter_comp.type - COMPOUND_WEDGE,
                           ec_ctx->compound_type_cdf[bsize],
                           MASKED_COMPOUND_TYPES);

        if (mbmi->interinter_comp.type == COMPOUND_WEDGE) {
          assert(is_interinter_compound_used(COMPOUND_WEDGE, bsize));
          aom_write_symbol(w, mbmi->interinter_comp.wedge_index,
                           ec_ctx->wedge_idx_cdf[bsize], MAX_WEDGE_TYPES);
          aom_write_bit(w, mbmi->interinter_comp.wedge_sign);
        } else {
          assert(mbmi->interinter_comp.type == COMPOUND_DIFFWTD);
          aom_write_literal(w, mbmi->interinter_comp.mask_type,
                            MAX_DIFFWTD_MASK_BITS);
        }
      }
    }
    write_mb_interp_filter(cm, td, w);
  }
}